

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

bool InitHTTPServer(SignalInterrupt *interrupt)

{
  unsigned_short *fmt;
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  DNSLookupFn dns_lookup_function_01;
  pointer pCVar3;
  pointer ppeVar4;
  pointer ppeVar5;
  bilingual_str *pbVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  __uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true> __dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  Logger *pLVar12;
  _Head_base<0UL,_evhttp_*,_false> args;
  ulong uVar13;
  CBaseChainParams *pCVar14;
  int64_t iVar15;
  int64_t iVar16;
  WorkQueue<HTTPClosure> *this;
  runtime_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bilingual_str *fmt_00;
  pointer this_01;
  pointer pcVar18;
  undefined8 uVar19;
  pointer name;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view in;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  char *pcVar20;
  undefined8 in_stack_fffffffffffffe68;
  uint16_t http_port;
  undefined6 uStack_18e;
  bilingual_str *local_188;
  pointer pbStack_180;
  raii_event_base base_ctr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  uint16_t port;
  undefined6 uStack_156;
  _Manager_type local_148;
  string local_138;
  raii_evhttp http_ctr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  int workQueueDepth;
  undefined4 uStack_f4;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  long *local_d8 [2];
  long local_c8 [2];
  string strAllowed;
  char local_98;
  undefined7 uStack_97;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  endpoints;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CSubNet,_std::allocator<CSubNet>_>::_M_erase_at_end
            (&rpc_allow_subnets,
             rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_e8._M_allocated_capacity = 0x2e302e302e373231;
  local_e8._8_2_ = 0x31;
  local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x9;
  _workQueueDepth = &local_e8;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&port,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._8_2_ = http_port;
  dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffe68;
  dns_lookup_function.super__Function_base._M_functor._10_6_ = uStack_18e;
  dns_lookup_function.super__Function_base._M_manager = (_Manager_type)local_188;
  dns_lookup_function._M_invoker = (_Invoker_type)pbStack_180;
  LookupHost((optional<CNetAddr> *)&strAllowed,(string *)&workQueueDepth,false,dns_lookup_function);
  if (local_98 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
    goto LAB_00474c1b;
  }
  endpoints.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(endpoints.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,8);
  std::vector<CSubNet,std::allocator<CSubNet>>::emplace_back<CNetAddr,int>
            ((vector<CSubNet,std::allocator<CSubNet>> *)&rpc_allow_subnets,(CNetAddr *)&strAllowed,
             (int *)&endpoints);
  if ((local_98 == '\x01') &&
     (local_98 = '\0', 0x10 < (uint)strAllowed.field_2._M_allocated_capacity._0_4_)) {
    free(strAllowed._M_dataplus._M_p);
    strAllowed._M_dataplus._M_p = (pointer)0x0;
  }
  if (local_148 != (_Manager_type)0x0) {
    (*local_148)((_Any_data *)&port,(_Any_data *)&port,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_workQueueDepth != &local_e8) {
    operator_delete((void *)_workQueueDepth,(ulong)(local_e8._M_allocated_capacity + 1));
  }
  local_e8._M_allocated_capacity._0_4_ = 0x313a3a;
  local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3;
  _workQueueDepth = &local_e8;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&base_ctr,&g_dns_lookup_abi_cxx11_);
  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base_ctr;
  dns_lookup_function_00.super__Function_base._M_functor._8_2_ = http_port;
  dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffe68;
  dns_lookup_function_00.super__Function_base._M_functor._10_6_ = uStack_18e;
  dns_lookup_function_00.super__Function_base._M_manager = (_Manager_type)local_188;
  dns_lookup_function_00._M_invoker = (_Invoker_type)pbStack_180;
  LookupHost((optional<CNetAddr> *)&strAllowed,(string *)&workQueueDepth,false,
             dns_lookup_function_00);
  if (local_98 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
    goto LAB_00474c1b;
  }
  std::vector<CSubNet,_std::allocator<CSubNet>_>::emplace_back<CNetAddr>
            (&rpc_allow_subnets,(CNetAddr *)&strAllowed);
  if ((local_98 == '\x01') &&
     (local_98 = '\0', 0x10 < (uint)strAllowed.field_2._M_allocated_capacity._0_4_)) {
    free(strAllowed._M_dataplus._M_p);
    strAllowed._M_dataplus._M_p = (pointer)0x0;
  }
  if ((_Manager_type)local_168._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_168._M_allocated_capacity)(&base_ctr,&base_ctr,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_workQueueDepth != &local_e8) {
    operator_delete((void *)_workQueueDepth,(ulong)(local_e8._M_allocated_capacity + 1));
  }
  strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
  strAllowed.field_2._M_allocated_capacity._4_4_ = 0x6f6c6c61;
  strAllowed.field_2._M_local_buf[8] = 'w';
  strAllowed.field_2._9_2_ = 0x7069;
  strAllowed._M_string_length = 0xb;
  strAllowed.field_2._M_local_buf[0xb] = '\0';
  strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&http_port,&gArgs,&strAllowed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
    operator_delete(strAllowed._M_dataplus._M_p,
                    CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                             strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
  }
  pbVar6 = local_188;
  fmt_00 = (bilingual_str *)CONCAT62(uStack_18e,http_port);
  if (fmt_00 != local_188) {
    do {
      LookupSubNet((CSubNet *)&endpoints,&fmt_00->original);
      bVar9 = CSubNet::IsValid((CSubNet *)&endpoints);
      if (bVar9) {
        std::vector<CSubNet,_std::allocator<CSubNet>_>::push_back
                  (&rpc_allow_subnets,(value_type *)&endpoints);
      }
      else {
        local_138._M_dataplus._M_p = (pointer)0xa7;
        http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
        super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
        _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                       (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)&local_108;
        __dest.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
        super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
        _M_head_impl = (__uniq_ptr_impl<evhttp,_evhttp_deleter>)
                       std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&http_ctr,(size_type *)&local_138,0);
        _Var7._M_p = local_138._M_dataplus._M_p;
        local_108._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
        http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
        super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
        _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                       (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                       __dest.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                       super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                       super__Head_base<0UL,_evhttp_*,_false>._M_head_impl;
        memcpy((void *)__dest.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                       super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                       super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,
               "Invalid -rpcallowip subnet specification: %s. Valid are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0) or a network/CIDR (e.g. 1.2.3.4/24)."
               ,0xa7);
        _Var7._M_p
        [(long)__dest.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
               super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
               super__Head_base<0UL,_evhttp_*,_false>._M_head_impl] = '\0';
        _workQueueDepth = &local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&workQueueDepth,
                   http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                   super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                   super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,
                   _Var7._M_p +
                   (long)http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                         super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                         super__Head_base<0UL,_evhttp_*,_false>._M_head_impl);
        local_d8[0] = local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,
                   http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                   super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                   super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,
                   _Var7._M_p +
                   (long)http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                         super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                         super__Head_base<0UL,_evhttp_*,_false>._M_head_impl);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&strAllowed,(tinyformat *)&workQueueDepth,fmt_00,pbVar11);
        local_138._M_string_length = 0;
        local_138.field_2._M_local_buf[0] = '\0';
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10000402;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        CClientUIInterface::ThreadSafeMessageBox
                  ((CClientUIInterface *)&uiInterface,(bilingual_str *)&strAllowed,&local_138,
                   0x10000402);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_97,local_98) != &local_88) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_97,local_98),local_88._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
          operator_delete(strAllowed._M_dataplus._M_p,
                          CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                   strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_workQueueDepth != &local_e8) {
          operator_delete((void *)_workQueueDepth,(ulong)(local_e8._M_allocated_capacity + 1));
        }
        if (http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
            super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
            _M_head_impl != (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)&local_108) {
          operator_delete((void *)http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                                  super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                                  super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,
                          local_108._M_allocated_capacity + 1);
        }
      }
      if (0x10 < (uint)endpoints.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        free(endpoints.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
      }
      if (!bVar9) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&http_port);
        bVar9 = false;
        goto LAB_0047465a;
      }
      fmt_00 = (bilingual_str *)&fmt_00->translated;
    } while (fmt_00 != pbVar6);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&http_port);
  pCVar3 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
  strAllowed._M_string_length = 0;
  strAllowed.field_2._M_allocated_capacity._0_4_ =
       strAllowed.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  if (rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
      super__Vector_impl_data._M_start !=
      rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      CSubNet::ToString_abi_cxx11_((string *)&endpoints,this_01);
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((string *)&endpoints," ");
      _workQueueDepth = &local_e8;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar11->_M_dataplus)._M_p;
      paVar17 = &pbVar11->field_2;
      if (paVar2 == paVar17) {
        local_e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_e8._8_8_ = *(ulong *)((long)&pbVar11->field_2 + 8);
      }
      else {
        local_e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
        _workQueueDepth = paVar2;
      }
      local_f0 = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&strAllowed,(char *)_workQueueDepth,local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_workQueueDepth != &local_e8) {
        operator_delete((void *)_workQueueDepth,(ulong)(local_e8._M_allocated_capacity + 1));
      }
      if (endpoints.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&endpoints.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(endpoints.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((endpoints.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)
                                       ._M_dataplus._M_p + 1));
      }
      this_01 = this_01 + 1;
    } while (this_01 != pCVar3);
  }
  pLVar12 = LogInstance();
  pcVar20 = (char *)0x473d03;
  bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar12,HTTP,Debug);
  if (bVar9) {
    logging_function._M_str = "InitHTTPAllowList";
    logging_function._M_len = 0x11;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0xee,
               IPC|COINDB|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|WALLETDB|BENCH|HTTP,
               (Level)&strAllowed,pcVar20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)interrupt);
  }
  paVar2 = &strAllowed.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strAllowed._M_dataplus._M_p != paVar2) {
    operator_delete(strAllowed._M_dataplus._M_p,
                    CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                             strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
  }
  event_set_log_callback(libevent_log_cb);
  pLVar12 = LogInstance();
  bVar9 = BCLog::Logger::WillLogCategory(pLVar12,LIBEVENT);
  event_enable_debug_logging(-(uint)bVar9);
  evthread_use_pthreads();
  base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
  super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
  super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
       (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)event_base_new();
  if ((tuple<event_base_*,_event_base_deleter>)
      base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
      super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
      super__Head_base<0UL,_event_base_*,_false>._M_head_impl ==
      (_Head_base<0UL,_event_base_*,_false>)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"cannot create event_base");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00474c1b;
  }
  args._M_head_impl =
       (evhttp *)
       evhttp_new(base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                  super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                  super__Head_base<0UL,_event_base_*,_false>._M_head_impl);
  http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
  super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
  _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                 (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)args._M_head_impl;
  if ((tuple<evhttp_*,_evhttp_deleter>)args._M_head_impl == (_Head_base<0UL,_evhttp_*,_false>)0x0) {
    pcVar20 = "couldn\'t create evhttp. Exiting.\n";
    iVar10 = 0x1c7;
LAB_00474616:
    logging_function_08._M_str = "InitHTTPServer";
    logging_function_08._M_len = 0xe;
    source_file_08._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file_08._M_len = 0x57;
    LogPrintf_<>(logging_function_08,source_file_08,iVar10,ALL,Info,pcVar20);
    bVar9 = false;
  }
  else {
    strAllowed._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&strAllowed,"-rpcservertimeout","");
    uVar13 = ArgsManager::GetIntArg(&gArgs,&strAllowed,0x1e);
    evhttp_set_timeout(args._M_head_impl,uVar13 & 0xffffffff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strAllowed._M_dataplus._M_p != paVar2) {
      operator_delete(strAllowed._M_dataplus._M_p,
                      CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                               strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
    }
    evhttp_set_max_headers_size(args._M_head_impl,0x2000);
    evhttp_set_max_body_size(args._M_head_impl,0x2000000);
    evhttp_set_gencb(args._M_head_impl,http_request_cb,interrupt);
    strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
    strAllowed.field_2._M_allocated_capacity._4_4_ = 0x74726f70;
    strAllowed._M_string_length = 8;
    strAllowed.field_2._M_local_buf[8] = '\0';
    strAllowed._M_dataplus._M_p = (pointer)paVar2;
    pCVar14 = BaseParams();
    iVar15 = ArgsManager::GetIntArg(&gArgs,&strAllowed,(ulong)pCVar14->m_rpc_port);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strAllowed._M_dataplus._M_p != paVar2) {
      operator_delete(strAllowed._M_dataplus._M_p,
                      CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                               strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
    }
    http_port = (uint16_t)iVar15;
    endpoints.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    endpoints.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    endpoints.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
    strAllowed.field_2._M_allocated_capacity._4_4_ = 0x6f6c6c61;
    strAllowed.field_2._M_local_buf[8] = 'w';
    strAllowed.field_2._9_2_ = 0x7069;
    strAllowed._M_string_length = 0xb;
    strAllowed.field_2._M_local_buf[0xb] = '\0';
    strAllowed._M_dataplus._M_p = (pointer)paVar2;
    bVar9 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
    if (bVar9) {
      local_e8._M_allocated_capacity = 0x646e69626370722d;
      local_f0 = &DAT_00000008;
      local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
      _workQueueDepth = &local_e8;
      bVar9 = ArgsManager::IsArgSet(&gArgs,(string *)&workQueueDepth);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_workQueueDepth != &local_e8) {
        operator_delete((void *)_workQueueDepth,(ulong)(local_e8._M_allocated_capacity + 1));
      }
    }
    else {
      bVar9 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strAllowed._M_dataplus._M_p != paVar2) {
      operator_delete(strAllowed._M_dataplus._M_p,
                      CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                               strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (bVar9 == false) {
      std::
      vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
      ::emplace_back<char_const(&)[4],unsigned_short&>
                ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                  *)&endpoints,(char (*) [4])"::1",&http_port);
      std::
      vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
      ::emplace_back<char_const(&)[10],unsigned_short&>
                ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                  *)&endpoints,(char (*) [10])"127.0.0.1",&http_port);
      strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
      strAllowed.field_2._M_allocated_capacity._4_4_ = 0x6f6c6c61;
      strAllowed.field_2._M_local_buf[8] = 'w';
      strAllowed.field_2._9_2_ = 0x7069;
      strAllowed._M_string_length = 0xb;
      strAllowed.field_2._M_local_buf[0xb] = '\0';
      strAllowed._M_dataplus._M_p = (pointer)paVar2;
      bVar9 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strAllowed._M_dataplus._M_p != paVar2) {
        operator_delete(strAllowed._M_dataplus._M_p,
                        CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                 strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar9) {
        logging_function_00._M_str = "HTTPBindAddresses";
        logging_function_00._M_len = 0x11;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file_00._M_len = 0x57;
        LogPrintf_<>(logging_function_00,source_file_00,0x170,ALL,Info,
                     "WARNING: option -rpcallowip was specified without -rpcbind; this doesn\'t usually make sense\n"
                    );
      }
      strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
      strAllowed.field_2._M_allocated_capacity._4_4_ = 0x646e6962;
      strAllowed._M_string_length = 8;
      strAllowed.field_2._M_local_buf[8] = '\0';
      strAllowed._M_dataplus._M_p = (pointer)paVar2;
      bVar9 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strAllowed._M_dataplus._M_p != paVar2) {
        operator_delete(strAllowed._M_dataplus._M_p,
                        CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                 strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar9) {
        logging_function_01._M_str = "HTTPBindAddresses";
        logging_function_01._M_len = 0x11;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file_01._M_len = 0x57;
        LogPrintf_<>(logging_function_01,source_file_01,0x173,ALL,Info,
                     "WARNING: option -rpcbind was ignored because -rpcallowip was not specified, refusing to allow everyone to connect\n"
                    );
      }
    }
    else {
      strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
      strAllowed.field_2._M_allocated_capacity._4_4_ = 0x646e6962;
      strAllowed._M_string_length = 8;
      strAllowed.field_2._M_local_buf[8] = '\0';
      strAllowed._M_dataplus._M_p = (pointer)paVar2;
      bVar9 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strAllowed._M_dataplus._M_p != paVar2) {
        operator_delete(strAllowed._M_dataplus._M_p,
                        CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                 strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar9) {
        strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
        strAllowed.field_2._M_allocated_capacity._4_4_ = 0x646e6962;
        strAllowed._M_string_length = 8;
        strAllowed.field_2._M_local_buf[8] = '\0';
        strAllowed._M_dataplus._M_p = (pointer)paVar2;
        ArgsManager::GetArgs
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&workQueueDepth,&gArgs,&strAllowed);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strAllowed._M_dataplus._M_p != paVar2) {
          operator_delete(strAllowed._M_dataplus._M_p,
                          CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                   strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
        }
        uVar8 = local_f0;
        if (_workQueueDepth != local_f0) {
          uVar19 = _workQueueDepth;
          do {
            port = http_port;
            strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
            strAllowed._M_string_length = 0;
            strAllowed.field_2._M_allocated_capacity._0_4_ =
                 strAllowed.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            in._M_str = *(char **)uVar19;
            in._M_len = *(size_t *)(uVar19 + 8);
            SplitHostPort(in,&port,&strAllowed);
            std::
            vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
            ::emplace_back<std::__cxx11::string&,unsigned_short&>
                      ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                        *)&endpoints,&strAllowed,&port);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
              operator_delete(strAllowed._M_dataplus._M_p,
                              CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                       strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
            }
            uVar19 = uVar19 + 0x20;
          } while (uVar19 != uVar8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&workQueueDepth);
      }
    }
    if (endpoints.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        endpoints.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      name = endpoints.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        fmt = &name->second;
        logging_function_02._M_str = "HTTPBindAddresses";
        logging_function_02._M_len = 0x11;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file_02._M_len = 0x57;
        LogPrintf_<std::__cxx11::string,unsigned_short>
                  (logging_function_02,source_file_02,0x180,
                   IPC|COINDB|RAND|ADDRMAN|WALLETDB|ZMQ|BENCH,(Level)name,(char *)fmt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   args._M_head_impl,(unsigned_short *)CONCAT62(uStack_18e,http_port));
        if ((name->first)._M_string_length == 0) {
          pcVar18 = (pointer)0x0;
        }
        else {
          pcVar18 = (name->first)._M_dataplus._M_p;
        }
        _port = evhttp_bind_socket_with_handle(args._M_head_impl,pcVar18,*fmt);
        if ((evhttp_bound_socket *)_port == (evhttp_bound_socket *)0x0) {
          logging_function_05._M_str = "HTTPBindAddresses";
          logging_function_05._M_len = 0x11;
          source_file_05._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file_05._M_len = 0x57;
          LogPrintf_<std::__cxx11::string,unsigned_short>
                    (logging_function_05,source_file_05,399,
                     IPC|COINDB|RAND|ADDRMAN|ESTIMATEFEE|WALLETDB,(Level)name,(char *)fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     args._M_head_impl,(unsigned_short *)CONCAT62(uStack_18e,http_port));
        }
        else {
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                      *)&workQueueDepth,&g_dns_lookup_abi_cxx11_);
          dns_lookup_function_01.super__Function_base._M_functor._8_2_ = http_port;
          dns_lookup_function_01.super__Function_base._M_functor._M_unused._M_object =
               args._M_head_impl;
          dns_lookup_function_01.super__Function_base._M_functor._10_6_ = uStack_18e;
          dns_lookup_function_01.super__Function_base._M_manager = (_Manager_type)local_188;
          dns_lookup_function_01._M_invoker = (_Invoker_type)pbStack_180;
          LookupHost((optional<CNetAddr> *)&strAllowed,&name->first,false,dns_lookup_function_01);
          if ((code *)local_e8._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_e8._M_allocated_capacity)
                      ((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                        *)&workQueueDepth,
                       (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                        *)&workQueueDepth,3);
          }
          if ((name->first)._M_string_length == 0) {
LAB_0047433c:
            logging_function_03._M_str = "HTTPBindAddresses";
            logging_function_03._M_len = 0x11;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
            ;
            source_file_03._M_len = 0x57;
            LogPrintf_<>(logging_function_03,source_file_03,0x185,ALL,Info,
                         "WARNING: the RPC server is not safe to expose to untrusted networks such as the public internet\n"
                        );
          }
          else if (local_98 == '\x01') {
            bVar9 = CNetAddr::IsBindAny((CNetAddr *)&strAllowed);
            if (bVar9) goto LAB_0047433c;
          }
          iVar10 = evhttp_bound_socket_get_fd(_port);
          local_138._M_dataplus._M_p._0_4_ = 1;
          iVar10 = setsockopt(iVar10,6,1,&local_138,4);
          if (iVar10 == -1) {
            logging_function_04._M_str = "HTTPBindAddresses";
            logging_function_04._M_len = 0x11;
            source_file_04._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
            ;
            source_file_04._M_len = 0x57;
            LogPrintf_<>(logging_function_04,source_file_04,0x18b,ALL,Info,
                         "WARNING: Unable to set TCP_NODELAY on RPC server socket, continuing anyway\n"
                        );
          }
          if (boundSockets.
              super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              boundSockets.
              super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<evhttp_bound_socket*,std::allocator<evhttp_bound_socket*>>::
            _M_realloc_insert<evhttp_bound_socket*const&>
                      ((vector<evhttp_bound_socket*,std::allocator<evhttp_bound_socket*>> *)
                       &boundSockets,
                       (iterator)
                       boundSockets.
                       super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(evhttp_bound_socket **)&port);
          }
          else {
            *boundSockets.
             super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = (evhttp_bound_socket *)_port;
            boundSockets.
            super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 boundSockets.
                 super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if ((local_98 == '\x01') &&
             (local_98 = '\0', 0x10 < (uint)strAllowed.field_2._M_allocated_capacity._0_4_)) {
            free(strAllowed._M_dataplus._M_p);
          }
        }
        name = name + 1;
      } while (name != endpoints.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    }
    ppeVar5 = boundSockets.
              super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppeVar4 = boundSockets.
              super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::~vector(&endpoints);
    if (ppeVar4 == ppeVar5) {
      pcVar20 = "Unable to bind any endpoint for RPC server\n";
      iVar10 = 0x1d1;
      goto LAB_00474616;
    }
    pLVar12 = LogInstance();
    bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar12,HTTP,Debug);
    if (bVar9) {
      logging_function_06._M_str = "InitHTTPServer";
      logging_function_06._M_len = 0xe;
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_06._M_len = 0x57;
      LogPrintf_<>(logging_function_06,source_file_06,0x1d5,HTTP,Debug,"Initialized HTTP server\n");
    }
    strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&strAllowed,"-rpcworkqueue","");
    iVar16 = ArgsManager::GetIntArg(&gArgs,&strAllowed,0x10);
    iVar15 = 1;
    if (1 < iVar16) {
      iVar15 = iVar16;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
      operator_delete(strAllowed._M_dataplus._M_p,
                      CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                               strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
    }
    workQueueDepth = (int)iVar15;
    pLVar12 = LogInstance();
    bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar12,HTTP,Debug);
    if (bVar9) {
      logging_function_07._M_str = "InitHTTPServer";
      logging_function_07._M_len = 0xe;
      source_file_07._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_07._M_len = 0x57;
      LogPrintf_<int>(logging_function_07,source_file_07,0x1d7,HTTP,Debug,
                      "creating work queue of depth %d\n",&workQueueDepth);
    }
    this = (WorkQueue<HTTPClosure> *)operator_new(0xb8);
    WorkQueue<HTTPClosure>::WorkQueue(this,(long)workQueueDepth);
    std::__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>::
    reset((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_> *)
          &g_work_queue,this);
    eventHTTP = (evhttp *)http_ctr;
    eventBase = (event_base *)base_ctr;
    base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
    super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
    super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
         (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)
         (__uniq_ptr_impl<event_base,_event_base_deleter>)0x0;
    http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
    super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
    _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                   (__uniq_ptr_impl<evhttp,_evhttp_deleter>)0x0;
    bVar9 = true;
  }
  std::unique_ptr<evhttp,_evhttp_deleter>::~unique_ptr(&http_ctr);
  std::unique_ptr<event_base,_event_base_deleter>::~unique_ptr(&base_ctr);
LAB_0047465a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar9;
  }
LAB_00474c1b:
  __stack_chk_fail();
}

Assistant:

bool InitHTTPServer(const util::SignalInterrupt& interrupt)
{
    if (!InitHTTPAllowList())
        return false;

    // Redirect libevent's logging to our own log
    event_set_log_callback(&libevent_log_cb);
    // Update libevent's log handling.
    UpdateHTTPServerLogging(LogInstance().WillLogCategory(BCLog::LIBEVENT));

#ifdef WIN32
    evthread_use_windows_threads();
#else
    evthread_use_pthreads();
#endif

    raii_event_base base_ctr = obtain_event_base();

    /* Create a new evhttp object to handle requests. */
    raii_evhttp http_ctr = obtain_evhttp(base_ctr.get());
    struct evhttp* http = http_ctr.get();
    if (!http) {
        LogPrintf("couldn't create evhttp. Exiting.\n");
        return false;
    }

    evhttp_set_timeout(http, gArgs.GetIntArg("-rpcservertimeout", DEFAULT_HTTP_SERVER_TIMEOUT));
    evhttp_set_max_headers_size(http, MAX_HEADERS_SIZE);
    evhttp_set_max_body_size(http, MAX_SIZE);
    evhttp_set_gencb(http, http_request_cb, (void*)&interrupt);

    if (!HTTPBindAddresses(http)) {
        LogPrintf("Unable to bind any endpoint for RPC server\n");
        return false;
    }

    LogDebug(BCLog::HTTP, "Initialized HTTP server\n");
    int workQueueDepth = std::max((long)gArgs.GetIntArg("-rpcworkqueue", DEFAULT_HTTP_WORKQUEUE), 1L);
    LogDebug(BCLog::HTTP, "creating work queue of depth %d\n", workQueueDepth);

    g_work_queue = std::make_unique<WorkQueue<HTTPClosure>>(workQueueDepth);
    // transfer ownership to eventBase/HTTP via .release()
    eventBase = base_ctr.release();
    eventHTTP = http_ctr.release();
    return true;
}